

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O1

void __thiscall
QMdi::ControlContainer::removeButtonsFromMenuBar(ControlContainer *this,QMenuBar *menuBar)

{
  QPointer<QWidget> *pQVar1;
  Data *pDVar2;
  bool bVar3;
  int iVar4;
  QObject *pQVar5;
  Data *pDVar6;
  QWidget *pQVar7;
  QWidgetPrivate *pQVar8;
  QWidget *pQVar9;
  long lVar10;
  char *pcVar11;
  char *pcVar12;
  QObject *pQVar13;
  long in_FS_OFFSET;
  QString local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (menuBar != (QMenuBar *)0x0) {
    pDVar2 = (this->m_menuBar).wp.d;
    if ((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) {
      pQVar5 = (QObject *)0x0;
    }
    else {
      pQVar5 = (this->m_menuBar).wp.value;
    }
    if (pQVar5 != (QObject *)menuBar) {
      pDVar2 = (this->previousRight).wp.d;
      (this->previousRight).wp.d = (Data *)0x0;
      (this->previousRight).wp.value = (QObject *)0x0;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        *(int *)pDVar2 = *(int *)pDVar2 + -1;
        UNLOCK();
        if (*(int *)pDVar2 == 0) {
          operator_delete(pDVar2);
        }
      }
      pDVar2 = (this->previousLeft).wp.d;
      (this->previousLeft).wp.d = (Data *)0x0;
      (this->previousLeft).wp.value = (QObject *)0x0;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        *(int *)pDVar2 = *(int *)pDVar2 + -1;
        UNLOCK();
        if (*(int *)pDVar2 == 0) {
          operator_delete(pDVar2);
        }
      }
      pDVar6 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)menuBar);
      pDVar2 = (this->m_menuBar).wp.d;
      (this->m_menuBar).wp.d = pDVar6;
      (this->m_menuBar).wp.value = (QObject *)menuBar;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        *(int *)pDVar2 = *(int *)pDVar2 + -1;
        UNLOCK();
        if (*(int *)pDVar2 == 0) {
          operator_delete(pDVar2);
        }
      }
    }
  }
  pDVar2 = (this->m_menuBar).wp.d;
  if ((((pDVar2 != (Data *)0x0) && (*(int *)(pDVar2 + 4) != 0)) &&
      ((this->m_menuBar).wp.value != (QObject *)0x0)) &&
     (((pDVar2 = (this->mdiChild).wp.d, pDVar2 != (Data *)0x0 && (*(int *)(pDVar2 + 4) != 0)) &&
      ((this->mdiChild).wp.value != (QObject *)0x0)))) {
    pQVar7 = QWidget::window((QWidget *)(this->mdiChild).wp.value);
    pQVar8 = qt_widget_private(pQVar7);
    if (((pQVar8->data).field_0x12 & 4) == 0) {
      pDVar2 = (this->m_controllerWidget).wp.d;
      if (pDVar2 == (Data *)0x0) {
        pQVar5 = (QObject *)0x0;
      }
      else {
        pQVar5 = (QObject *)0x0;
        if ((*(int *)(pDVar2 + 4) != 0) && ((this->m_controllerWidget).wp.value != (QObject *)0x0))
        {
          pQVar7 = QMenuBar::cornerWidget((QMenuBar *)(this->m_menuBar).wp.value,TopRightCorner);
          pDVar2 = (this->m_controllerWidget).wp.d;
          if ((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) {
            pQVar9 = (QWidget *)0x0;
          }
          else {
            pQVar9 = (QWidget *)(this->m_controllerWidget).wp.value;
          }
          if (pQVar9 == pQVar7) {
            pDVar2 = (this->previousRight).wp.d;
            if ((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) {
              pQVar5 = (QObject *)0x0;
            }
            else {
              pQVar5 = (this->previousRight).wp.value;
            }
            if (pQVar5 == (QObject *)0x0) {
LAB_0045270c:
              pQVar5 = (QObject *)0x0;
            }
            else {
              lVar10 = (**(code **)(*(long *)pQVar5 + 8))();
              if (lVar10 == 0) goto LAB_0045270c;
              (*(code *)**(undefined8 **)pQVar5)(pQVar5);
              pcVar11 = (char *)QMetaObject::className();
              pcVar12 = (char *)QMetaObject::className();
              iVar4 = strcmp(pcVar11,pcVar12);
              if (iVar4 != 0) goto LAB_0045270c;
            }
            pQVar1 = &this->previousRight;
            if (pQVar5 == (QObject *)0x0) {
LAB_00452849:
              pQVar5 = (QObject *)0x0;
            }
            else {
              if (((*(long *)(pQVar5 + 0x38) == 0) || (*(int *)(*(long *)(pQVar5 + 0x38) + 4) == 0))
                 || (*(long *)(pQVar5 + 0x40) == 0)) {
LAB_00452830:
                pDVar2 = (pQVar1->wp).d;
                (pQVar1->wp).d = (Data *)0x0;
                (this->previousRight).wp.value = (QObject *)0x0;
                if (pDVar2 != (Data *)0x0) {
                  LOCK();
                  *(int *)pDVar2 = *(int *)pDVar2 + -1;
                  UNLOCK();
                  if (*(int *)pDVar2 == 0) {
                    operator_delete(pDVar2);
                  }
                }
                goto LAB_00452849;
              }
              bVar3 = QWidget::isMaximized(*(QWidget **)(pQVar5 + 0x40));
              if (!bVar3) goto LAB_00452830;
              if ((*(long *)(pQVar5 + 0x38) == 0) || (*(int *)(*(long *)(pQVar5 + 0x38) + 4) == 0))
              goto LAB_00452849;
              pQVar5 = *(QObject **)(pQVar5 + 0x40);
            }
            pDVar2 = (this->m_menuBar).wp.d;
            if ((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) {
              pQVar13 = (QObject *)0x0;
            }
            else {
              pQVar13 = (this->m_menuBar).wp.value;
            }
            pDVar2 = (pQVar1->wp).d;
            if ((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) {
              pQVar7 = (QWidget *)0x0;
            }
            else {
              pQVar7 = (QWidget *)(this->previousRight).wp.value;
            }
            QMenuBar::setCornerWidget((QMenuBar *)pQVar13,pQVar7,TopRightCorner);
            pDVar2 = (pQVar1->wp).d;
            if (((pDVar2 != (Data *)0x0) && (*(int *)(pDVar2 + 4) != 0)) &&
               ((this->previousRight).wp.value != (QObject *)0x0)) {
              QWidget::show((QWidget *)(this->previousRight).wp.value);
              pDVar2 = (this->previousRight).wp.d;
              (pQVar1->wp).d = (Data *)0x0;
              (this->previousRight).wp.value = (QObject *)0x0;
              if (pDVar2 != (Data *)0x0) {
                LOCK();
                *(int *)pDVar2 = *(int *)pDVar2 + -1;
                UNLOCK();
                if (*(int *)pDVar2 == 0) {
                  operator_delete(pDVar2);
                }
              }
            }
          }
          else {
            pQVar5 = (QObject *)0x0;
          }
          QWidget::hide((QWidget *)(this->m_controllerWidget).wp.value);
          QWidget::setParent((QWidget *)(this->m_controllerWidget).wp.value,(QWidget *)0x0);
        }
      }
      pDVar2 = (this->m_menuLabel).wp.d;
      if (((pDVar2 != (Data *)0x0) && (*(int *)(pDVar2 + 4) != 0)) &&
         ((this->m_menuLabel).wp.value != (QObject *)0x0)) {
        pQVar7 = (QWidget *)0x0;
        pQVar9 = QMenuBar::cornerWidget((QMenuBar *)(this->m_menuBar).wp.value,TopLeftCorner);
        pDVar2 = (this->m_menuLabel).wp.d;
        if (pDVar2 != (Data *)0x0) {
          if (*(int *)(pDVar2 + 4) == 0) {
            pQVar7 = (QWidget *)0x0;
          }
          else {
            pQVar7 = (QWidget *)(this->m_menuLabel).wp.value;
          }
        }
        if (pQVar7 == pQVar9) {
          pDVar2 = (this->previousLeft).wp.d;
          if ((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) {
            pQVar13 = (QObject *)0x0;
          }
          else {
            pQVar13 = (this->previousLeft).wp.value;
          }
          if (pQVar13 == (QObject *)0x0) {
LAB_004527bf:
            pQVar13 = (QObject *)0x0;
          }
          else {
            lVar10 = (**(code **)(*(long *)pQVar13 + 8))();
            if (lVar10 == 0) goto LAB_004527bf;
            (*(code *)**(undefined8 **)pQVar13)(pQVar13);
            pcVar11 = (char *)QMetaObject::className();
            pcVar12 = (char *)QMetaObject::className();
            iVar4 = strcmp(pcVar11,pcVar12);
            if (iVar4 != 0) goto LAB_004527bf;
          }
          pQVar1 = &this->previousLeft;
          if (pQVar13 != (QObject *)0x0) {
            if (((*(long *)(pQVar13 + 0x48) != 0) && (*(int *)(*(long *)(pQVar13 + 0x48) + 4) != 0))
               && (*(long *)(pQVar13 + 0x50) != 0)) {
              bVar3 = QWidget::isMaximized(*(QWidget **)(pQVar13 + 0x50));
              if (bVar3) {
                if (pQVar5 == (QObject *)0x0) {
                  pDVar2 = (this->mdiChild).wp.d;
                  if ((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) {
                    pQVar5 = (QObject *)0x0;
                  }
                  else {
                    pQVar5 = (this->mdiChild).wp.value;
                  }
                }
                goto LAB_004528f3;
              }
            }
            pDVar2 = (pQVar1->wp).d;
            (pQVar1->wp).d = (Data *)0x0;
            (this->previousLeft).wp.value = (QObject *)0x0;
            if (pDVar2 != (Data *)0x0) {
              LOCK();
              *(int *)pDVar2 = *(int *)pDVar2 + -1;
              UNLOCK();
              if (*(int *)pDVar2 == 0) {
                operator_delete(pDVar2);
              }
            }
          }
LAB_004528f3:
          pDVar2 = (this->m_menuBar).wp.d;
          if ((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) {
            pQVar13 = (QObject *)0x0;
          }
          else {
            pQVar13 = (this->m_menuBar).wp.value;
          }
          pDVar2 = (pQVar1->wp).d;
          if ((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) {
            pQVar7 = (QWidget *)0x0;
          }
          else {
            pQVar7 = (QWidget *)(this->previousLeft).wp.value;
          }
          QMenuBar::setCornerWidget((QMenuBar *)pQVar13,pQVar7,TopLeftCorner);
          pDVar2 = (pQVar1->wp).d;
          if (((pDVar2 != (Data *)0x0) && (*(int *)(pDVar2 + 4) != 0)) &&
             ((this->previousLeft).wp.value != (QObject *)0x0)) {
            QWidget::show((QWidget *)(this->previousLeft).wp.value);
            pDVar2 = (this->previousLeft).wp.d;
            (pQVar1->wp).d = (Data *)0x0;
            (this->previousLeft).wp.value = (QObject *)0x0;
            if (pDVar2 != (Data *)0x0) {
              LOCK();
              *(int *)pDVar2 = *(int *)pDVar2 + -1;
              UNLOCK();
              if (*(int *)pDVar2 == 0) {
                operator_delete(pDVar2);
              }
            }
          }
        }
        QWidget::hide((QWidget *)(this->m_menuLabel).wp.value);
        QWidget::setParent((QWidget *)(this->m_menuLabel).wp.value,(QWidget *)0x0);
      }
      QWidget::update((QWidget *)(this->m_menuBar).wp.value);
      if (pQVar5 != (QObject *)0x0) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
          QMdiSubWindowPrivate::setNewWindowTitle(*(QMdiSubWindowPrivate **)(pQVar5 + 8));
          return;
        }
        goto LAB_00452986;
      }
      pDVar2 = (this->mdiChild).wp.d;
      if (((pDVar2 != (Data *)0x0) && (*(int *)(pDVar2 + 4) != 0)) &&
         ((this->mdiChild).wp.value != (QObject *)0x0)) {
        pQVar7 = QWidget::window((QWidget *)(this->mdiChild).wp.value);
        QMdiSubWindowPrivate::originalWindowTitle
                  (&local_40,*(QMdiSubWindowPrivate **)((this->mdiChild).wp.value + 8));
        QWidget::setWindowTitle(pQVar7,&local_40);
        if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
LAB_00452986:
  __stack_chk_fail();
}

Assistant:

void ControlContainer::removeButtonsFromMenuBar(QMenuBar *menuBar)
{
    if (menuBar && menuBar != m_menuBar) {
        // m_menubar was deleted while sub-window was maximized
        previousRight = nullptr;
        previousLeft = nullptr;
        m_menuBar = menuBar;
    }

    if (!m_menuBar || !mdiChild || qt_widget_private(mdiChild->window())->data.in_destructor)
        return;

    QMdiSubWindow *child = nullptr;
    if (m_controllerWidget) {
        QWidget *currentRight = m_menuBar->cornerWidget(Qt::TopRightCorner);
        if (currentRight == m_controllerWidget) {
            if (ControlElement<ControllerWidget> *ce = ptr<ControllerWidget>(previousRight)) {
                if (!ce->mdiChild || !ce->mdiChild->isMaximized())
                    previousRight = nullptr;
                else
                    child = ce->mdiChild;
            }
            m_menuBar->setCornerWidget(previousRight, Qt::TopRightCorner);
            if (previousRight) {
                previousRight->show();
                previousRight = nullptr;
            }
        }
        m_controllerWidget->hide();
        m_controllerWidget->setParent(nullptr);
    }
    if (m_menuLabel) {
        QWidget *currentLeft = m_menuBar->cornerWidget(Qt::TopLeftCorner);
        if (currentLeft == m_menuLabel) {
            if (ControlElement<ControlLabel> *ce = ptr<ControlLabel>(previousLeft)) {
                if (!ce->mdiChild || !ce->mdiChild->isMaximized())
                    previousLeft = nullptr;
                else if (!child)
                    child = mdiChild;
            }
            m_menuBar->setCornerWidget(previousLeft, Qt::TopLeftCorner);
            if (previousLeft) {
                previousLeft->show();
                previousLeft = nullptr;
            }
        }
        m_menuLabel->hide();
        m_menuLabel->setParent(nullptr);
    }
    m_menuBar->update();
    if (child)
        child->d_func()->setNewWindowTitle();
    else if (mdiChild)
        mdiChild->window()->setWindowTitle(mdiChild->d_func()->originalWindowTitle());
}